

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *window)

{
  ImGuiWindow **ppIVar1;
  ImGuiWindow *in_RDI;
  ImVec2 IVar2;
  ImRect *unaff_retaddr;
  ImGuiDir *in_stack_00000008;
  ImVec2 *in_stack_00000010;
  ImVec2 *in_stack_00000018;
  ImRect r_avoid_2;
  ImVec2 ref_pos;
  float sc;
  ImRect r_avoid_1;
  ImRect r_avoid;
  float horizontal_overlap;
  ImGuiWindow *parent_window;
  ImRect r_outer;
  ImGuiContext *g;
  ImVec2 pos;
  undefined4 in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  ImVector<ImGuiWindow_*> *in_stack_ffffffffffffff30;
  float fVar3;
  undefined8 in_stack_ffffffffffffff38;
  float fVar4;
  ImVec2 in_stack_ffffffffffffff40;
  ImGuiWindow *in_stack_ffffffffffffff50;
  undefined1 local_74 [16];
  undefined8 local_64;
  undefined8 local_5c;
  undefined8 local_54;
  undefined8 local_4c;
  undefined8 local_44;
  undefined8 local_3c;
  float local_34;
  ImGuiWindow *local_30;
  ImRect local_28;
  ImGuiContext *local_18;
  ImGuiPopupPositionPolicy policy;
  ImRect *in_stack_fffffffffffffff8;
  
  local_18 = GImGui;
  local_28 = GetWindowAllowedExtentRect(in_stack_ffffffffffffff50);
  if ((in_RDI->Flags & 0x10000000U) == 0) {
    if ((in_RDI->Flags & 0x4000000U) == 0) {
      if ((in_RDI->Flags & 0x2000000U) == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                      ,0x1f37,"ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *)");
      }
      NavCalcPreferredRefPos();
      ImRect::ImRect((ImRect *)in_stack_ffffffffffffff30);
      fVar3 = (float)((ulong)in_stack_ffffffffffffff30 >> 0x20);
      fVar4 = (float)((ulong)in_stack_ffffffffffffff38 >> 0x20);
      if ((((local_18->NavDisableHighlight & 1U) == 0) &&
          ((local_18->NavDisableMouseHover & 1U) != 0)) && (((local_18->IO).ConfigFlags & 4U) == 0))
      {
        ImRect::ImRect((ImRect *)in_stack_ffffffffffffff40,fVar4,(float)in_stack_ffffffffffffff38,
                       fVar3,SUB84(in_stack_ffffffffffffff30,0));
      }
      else {
        ImRect::ImRect((ImRect *)in_stack_ffffffffffffff40,fVar4,(float)in_stack_ffffffffffffff38,
                       fVar3,SUB84(in_stack_ffffffffffffff30,0));
      }
      IVar2 = FindBestWindowPosForPopupEx
                        (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                         in_stack_fffffffffffffff8,(ImGuiPopupPositionPolicy)((ulong)in_RDI >> 0x20)
                        );
      if (in_RDI->AutoPosLastDirection == -1) {
        ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff40,2.0,2.0);
        IVar2 = operator+((ImVec2 *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                          (ImVec2 *)0x1c57d1);
      }
    }
    else {
      ImRect::ImRect((ImRect *)in_stack_ffffffffffffff40,(float)((ulong)local_74 >> 0x20),
                     SUB84(local_74,0),(float)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                     SUB84(in_stack_ffffffffffffff30,0));
      IVar2 = FindBestWindowPosForPopupEx
                        (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                         in_stack_fffffffffffffff8,(ImGuiPopupPositionPolicy)((ulong)in_RDI >> 0x20)
                        );
    }
  }
  else {
    if (local_18->CurrentWindow != in_RDI) {
      __assert_fail("g.CurrentWindow == window",
                    "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                    ,0x1f19,"ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow *)");
    }
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[]
                        (in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
    policy = (ImGuiPopupPositionPolicy)((ulong)in_RDI >> 0x20);
    local_30 = *ppIVar1;
    local_34 = (local_18->Style).ItemInnerSpacing.x;
    ImRect::ImRect((ImRect *)in_stack_ffffffffffffff30);
    fVar3 = (float)((ulong)in_stack_ffffffffffffff30 >> 0x20);
    fVar4 = (float)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    if (((local_30->DC).MenuBarAppending & 1U) == 0) {
      ImRect::ImRect((ImRect *)in_stack_ffffffffffffff40,fVar4,(float)in_stack_ffffffffffffff38,
                     fVar3,SUB84(in_stack_ffffffffffffff30,0));
      local_44 = local_64;
      local_3c = local_5c;
    }
    else {
      ImRect::ImRect((ImRect *)in_stack_ffffffffffffff40,fVar4,(float)in_stack_ffffffffffffff38,
                     fVar3,SUB84(in_stack_ffffffffffffff30,0));
      local_44 = local_54;
      local_3c = local_4c;
    }
    IVar2 = FindBestWindowPosForPopupEx
                      (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                       in_stack_fffffffffffffff8,policy);
  }
  return IVar2;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopup(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    ImRect r_outer = GetWindowAllowedExtentRect(window);
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
    {
        // Child menus typically request _any_ position within the parent menu item, and then we move the new menu outside the parent bounds.
        // This is how we end up with child menus appearing (most-commonly) on the right of the parent menu.
        IM_ASSERT(g.CurrentWindow == window);
        ImGuiWindow* parent_window = g.CurrentWindowStack[g.CurrentWindowStack.Size - 2];
        float horizontal_overlap = g.Style.ItemInnerSpacing.x; // We want some overlap to convey the relative depth of each menu (currently the amount of overlap is hard-coded to style.ItemSpacing.x).
        ImRect r_avoid;
        if (parent_window->DC.MenuBarAppending)
            r_avoid = ImRect(-FLT_MAX, parent_window->ClipRect.Min.y, FLT_MAX, parent_window->ClipRect.Max.y); // Avoid parent menu-bar. If we wanted multi-line menu-bar, we may instead want to have the calling window setup e.g. a NextWindowData.PosConstraintAvoidRect field
        else
            r_avoid = ImRect(parent_window->Pos.x + horizontal_overlap, -FLT_MAX, parent_window->Pos.x + parent_window->Size.x - horizontal_overlap - parent_window->ScrollbarSizes.x, FLT_MAX);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Popup)
    {
        ImRect r_avoid = ImRect(window->Pos.x - 1, window->Pos.y - 1, window->Pos.x + 1, window->Pos.y + 1);
        return FindBestWindowPosForPopupEx(window->Pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
    }
    if (window->Flags & ImGuiWindowFlags_Tooltip)
    {
        // Position tooltip (always follows mouse)
        float sc = g.Style.MouseCursorScale;
        ImVec2 ref_pos = NavCalcPreferredRefPos();
        ImRect r_avoid;
        if (!g.NavDisableHighlight && g.NavDisableMouseHover && !(g.IO.ConfigFlags & ImGuiConfigFlags_NavEnableSetMousePos))
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 16, ref_pos.y + 8);
        else
            r_avoid = ImRect(ref_pos.x - 16, ref_pos.y - 8, ref_pos.x + 24 * sc, ref_pos.y + 24 * sc); // FIXME: Hard-coded based on mouse cursor shape expectation. Exact dimension not very important.
        ImVec2 pos = FindBestWindowPosForPopupEx(ref_pos, window->Size, &window->AutoPosLastDirection, r_outer, r_avoid);
        if (window->AutoPosLastDirection == ImGuiDir_None)
            pos = ref_pos + ImVec2(2, 2); // If there's not enough room, for tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
        return pos;
    }
    IM_ASSERT(0);
    return window->Pos;
}